

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitrate.c
# Opt level: O1

int vorbis_bitrate_addblock(vorbis_block *vb)

{
  void *pvVar1;
  vorbis_info *pvVar2;
  void *pvVar3;
  void *pvVar4;
  double dVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined8 *puVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  undefined8 *puVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  int local_38;
  
  pvVar1 = vb->internal;
  pvVar2 = vb->vd->vi;
  pvVar3 = vb->vd->backend_state;
  pvVar4 = pvVar2->codec_setup;
  dVar23 = rint(*(double *)((long)pvVar3 + 200));
  uVar13 = (uint)dVar23;
  uVar8 = (ulong)uVar13;
  lVar6 = oggpack_bytes(*(oggpack_buffer **)((long)pvVar1 + (long)(int)uVar13 * 8 + 0x10));
  lVar7 = vb->W;
  lVar9 = *(long *)((long)pvVar3 + 0xb0);
  if (lVar7 != 0) {
    lVar9 = lVar9 * *(long *)((long)pvVar3 + 0xc0);
  }
  lVar11 = *(long *)((long)pvVar3 + 0xb8);
  if (lVar7 != 0) {
    lVar11 = lVar11 * *(long *)((long)pvVar3 + 0xc0);
  }
  if (*(int *)((long)pvVar3 + 0x90) == 0) {
    if (*(long *)((long)pvVar3 + 0xd0) != 0) {
      return -1;
    }
    *(vorbis_block **)((long)pvVar3 + 0xd0) = vb;
    return 0;
  }
  puVar12 = (undefined8 *)((long)pvVar1 + 0x10);
  lVar6 = lVar6 * 8;
  lVar10 = (long)((double)*(long *)((long)pvVar4 + 0x1558) * *(double *)((long)pvVar4 + 0x1560));
  uVar18 = *(ulong *)((long)pvVar4 + lVar7 * 8);
  *(vorbis_block **)((long)pvVar3 + 0xd0) = vb;
  lVar17 = *(long *)((long)pvVar3 + 0xa8);
  if (0 < lVar17) {
    if (lVar7 != 0) {
      lVar17 = lVar17 * *(long *)((long)pvVar3 + 0xc0);
    }
    dVar23 = 15.0 / *(double *)((long)pvVar4 + 0x1568);
    lVar7 = (lVar6 - lVar17) + *(long *)((long)pvVar3 + 0x98);
    if (lVar10 < lVar7) {
      if ((0 < (int)uVar13) && (lVar17 < lVar6)) {
        uVar19 = (ulong)uVar13;
        while (uVar8 = uVar19, lVar10 < (lVar6 - lVar17) + *(long *)((long)pvVar3 + 0x98)) {
          uVar8 = uVar19 - 1;
          lVar6 = oggpack_bytes(*(oggpack_buffer **)((long)pvVar1 + uVar19 * 8 + 8));
          if (((long)uVar19 < 2) || (lVar6 = lVar6 * 8, uVar19 = uVar8, lVar6 <= lVar17)) break;
        }
      }
    }
    else if ((lVar7 < lVar10) && (uVar19 = (long)(int)uVar13, (int)uVar13 < 0xe)) {
      for (; (lVar6 < lVar17 &&
             (uVar8 = uVar19, (lVar6 - lVar17) + *(long *)((long)pvVar3 + 0x98) < lVar10));
          lVar6 = lVar6 << 3) {
        uVar8 = uVar19 + 1;
        lVar6 = oggpack_bytes(*(oggpack_buffer **)((long)pvVar1 + uVar19 * 8 + 0x18));
        if (0xc < (long)uVar19) break;
        uVar19 = uVar8;
      }
    }
    dVar24 = *(double *)((long)pvVar3 + 200);
    dVar5 = rint((double)(int)uVar8 - dVar24);
    local_38 = (int)(uVar18 >> 1);
    dVar21 = (double)pvVar2->rate;
    dVar5 = (dVar5 / (double)local_38) * dVar21;
    dVar22 = -dVar23;
    if (-dVar23 <= dVar5) {
      dVar22 = dVar5;
    }
    if (dVar22 <= dVar23) {
      dVar23 = dVar22;
    }
    dVar24 = (dVar23 / dVar21) * (double)local_38 + dVar24;
    *(double *)((long)pvVar3 + 200) = dVar24;
    dVar23 = rint(dVar24);
    uVar8 = (ulong)(uint)(int)dVar23;
    lVar6 = oggpack_bytes((oggpack_buffer *)puVar12[(int)dVar23]);
    lVar6 = lVar6 << 3;
  }
  if (((0 < *(long *)((long)pvVar3 + 0xb0)) && (lVar6 < lVar9)) &&
     ((lVar6 - lVar9) + *(long *)((long)pvVar3 + 0xa0) < 0)) {
    iVar14 = (int)uVar8;
    uVar18 = 0xe;
    if (0xe < iVar14) {
      uVar18 = uVar8;
    }
    iVar15 = (int)uVar18;
    if (iVar14 < 0xe) {
      lVar7 = 0;
      do {
        lVar6 = oggpack_bytes(*(oggpack_buffer **)
                               ((long)pvVar1 + lVar7 * 8 + (long)iVar14 * 8 + 0x18));
        lVar6 = lVar6 * 8;
        if (-1 < (lVar6 - lVar9) + *(long *)((long)pvVar3 + 0xa0)) {
          iVar15 = iVar14 + (int)lVar7;
          break;
        }
        lVar7 = lVar7 + 1;
      } while (uVar18 - (long)iVar14 != lVar7);
    }
    uVar8 = (ulong)(iVar15 + 1);
  }
  uVar16 = (uint)uVar8;
  uVar13 = uVar16;
  if (((0 < *(long *)((long)pvVar3 + 0xb8)) && (lVar6 - lVar11 != 0 && lVar11 <= lVar6)) &&
     ((*(long *)((long)pvVar4 + 0x1558) < (lVar6 - lVar11) + *(long *)((long)pvVar3 + 0xa0) &&
      (uVar13 = uVar16 - 1, 0 < (int)uVar16)))) {
    puVar20 = (undefined8 *)((long)pvVar1 + (ulong)uVar13 * 8 + 0x10);
    do {
      uVar16 = (uint)uVar8;
      lVar6 = oggpack_bytes((oggpack_buffer *)*puVar20);
      lVar6 = lVar6 * 8;
      uVar13 = uVar16;
      if ((lVar6 - lVar11) + *(long *)((long)pvVar3 + 0xa0) <= *(long *)((long)pvVar4 + 0x1558))
      break;
      puVar20 = puVar20 + -1;
      uVar13 = uVar16 - 1;
      uVar8 = (ulong)uVar13;
    } while (uVar13 != 0 && 0 < (int)uVar16);
    uVar13 = uVar13 - 1;
  }
  if ((int)uVar13 < 0) {
    lVar17 = (*(long *)((long)pvVar4 + 0x1558) + lVar11) - *(long *)((long)pvVar3 + 0xa0);
    lVar7 = lVar17 + 7;
    if (-1 < lVar17) {
      lVar7 = lVar17;
    }
    *(undefined4 *)((long)pvVar3 + 0xd8) = 0;
    lVar17 = oggpack_bytes((oggpack_buffer *)*puVar12);
    if (lVar7 >> 3 < lVar17) {
      oggpack_writetrunc((oggpack_buffer *)*puVar12,(lVar7 >> 3) << 3);
      goto LAB_001da853;
    }
  }
  else {
    lVar6 = lVar9 - *(long *)((long)pvVar3 + 0xa0);
    lVar7 = lVar6 + 7;
    lVar6 = lVar6 + 0xe;
    if (-1 < lVar7) {
      lVar6 = lVar7;
    }
    uVar8 = 0xe;
    if ((int)uVar13 < 0xe) {
      uVar8 = (ulong)uVar13;
    }
    *(int *)((long)pvVar3 + 0xd8) = (int)uVar8;
    puVar12 = puVar12 + uVar8;
    lVar7 = oggpack_bytes((oggpack_buffer *)*puVar12);
    lVar17 = (lVar6 >> 3) - lVar7;
    if (lVar17 != 0 && lVar7 <= lVar6 >> 3) {
      lVar17 = lVar17 + 1;
      do {
        oggpack_write((oggpack_buffer *)*puVar12,0,8);
        lVar17 = lVar17 + -1;
      } while (1 < lVar17);
    }
LAB_001da853:
    lVar6 = oggpack_bytes((oggpack_buffer *)*puVar12);
    lVar6 = lVar6 << 3;
  }
  if ((*(long *)((long)pvVar3 + 0xb0) < 1) && (*(long *)((long)pvVar3 + 0xb8) < 1))
  goto LAB_001da8a4;
  if (((0 < lVar11) && (lVar7 = lVar6 - lVar11, lVar7 != 0 && lVar11 <= lVar6)) ||
     ((0 < lVar9 && (lVar7 = lVar6 - lVar9, lVar6 < lVar9)))) {
    *(long *)((long)pvVar3 + 0xa0) = *(long *)((long)pvVar3 + 0xa0) + lVar7;
    goto LAB_001da8a4;
  }
  lVar7 = *(long *)((long)pvVar3 + 0xa0);
  if (lVar10 < lVar7) {
    if (lVar11 < 1) {
LAB_001da92f:
      *(long *)((long)pvVar3 + 0xa0) = lVar10;
      goto LAB_001da8a4;
    }
    lVar7 = (lVar6 - lVar11) + lVar7;
    if (lVar7 <= lVar10) {
      lVar7 = lVar10;
    }
  }
  else {
    if (lVar9 < 1) goto LAB_001da92f;
    lVar7 = (lVar6 - lVar9) + lVar7;
    if (lVar10 <= lVar7) {
      lVar7 = lVar10;
    }
  }
  *(long *)((long)pvVar3 + 0xa0) = lVar7;
LAB_001da8a4:
  lVar7 = *(long *)((long)pvVar3 + 0xa8);
  if (0 < lVar7) {
    if (vb->W != 0) {
      lVar7 = lVar7 * *(long *)((long)pvVar3 + 0xc0);
    }
    *(long *)((long)pvVar3 + 0x98) = *(long *)((long)pvVar3 + 0x98) + (lVar6 - lVar7);
  }
  return 0;
}

Assistant:

int vorbis_bitrate_addblock(vorbis_block *vb){
  vorbis_block_internal *vbi=vb->internal;
  vorbis_dsp_state      *vd=vb->vd;
  private_state         *b=vd->backend_state;
  bitrate_manager_state *bm=&b->bms;
  vorbis_info           *vi=vd->vi;
  codec_setup_info      *ci=vi->codec_setup;
  bitrate_manager_info  *bi=&ci->bi;

  int  choice=rint(bm->avgfloat);
  long this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
  long min_target_bits=(vb->W?bm->min_bitsper*bm->short_per_long:bm->min_bitsper);
  long max_target_bits=(vb->W?bm->max_bitsper*bm->short_per_long:bm->max_bitsper);
  int  samples=ci->blocksizes[vb->W]>>1;
  long desired_fill=bi->reservoir_bits*bi->reservoir_bias;
  if(!bm->managed){
    /* not a bitrate managed stream, but for API simplicity, we'll
       buffer the packet to keep the code path clean */

    if(bm->vb)return(-1); /* one has been submitted without
                             being claimed */
    bm->vb=vb;
    return(0);
  }

  bm->vb=vb;

  /* look ahead for avg floater */
  if(bm->avg_bitsper>0){
    double slew=0.;
    long avg_target_bits=(vb->W?bm->avg_bitsper*bm->short_per_long:bm->avg_bitsper);
    double slewlimit= 15./bi->slew_damp;

    /* choosing a new floater:
       if we're over target, we slew down
       if we're under target, we slew up

       choose slew as follows: look through packetblobs of this frame
       and set slew as the first in the appropriate direction that
       gives us the slew we want.  This may mean no slew if delta is
       already favorable.

       Then limit slew to slew max */

    if(bm->avg_reservoir+(this_bits-avg_target_bits)>desired_fill){
      while(choice>0 && this_bits>avg_target_bits &&
            bm->avg_reservoir+(this_bits-avg_target_bits)>desired_fill){
        choice--;
        this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
      }
    }else if(bm->avg_reservoir+(this_bits-avg_target_bits)<desired_fill){
      while(choice+1<PACKETBLOBS && this_bits<avg_target_bits &&
            bm->avg_reservoir+(this_bits-avg_target_bits)<desired_fill){
        choice++;
        this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
      }
    }

    slew=rint(choice-bm->avgfloat)/samples*vi->rate;
    if(slew<-slewlimit)slew=-slewlimit;
    if(slew>slewlimit)slew=slewlimit;
    choice=rint(bm->avgfloat+= slew/vi->rate*samples);
    this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
  }



  /* enforce min(if used) on the current floater (if used) */
  if(bm->min_bitsper>0){
    /* do we need to force the bitrate up? */
    if(this_bits<min_target_bits){
      while(bm->minmax_reservoir-(min_target_bits-this_bits)<0){
        choice++;
        if(choice>=PACKETBLOBS)break;
        this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
      }
    }
  }

  /* enforce max (if used) on the current floater (if used) */
  if(bm->max_bitsper>0){
    /* do we need to force the bitrate down? */
    if(this_bits>max_target_bits){
      while(bm->minmax_reservoir+(this_bits-max_target_bits)>bi->reservoir_bits){
        choice--;
        if(choice<0)break;
        this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
      }
    }
  }

  /* Choice of packetblobs now made based on floater, and min/max
     requirements. Now boundary check extreme choices */

  if(choice<0){
    /* choosing a smaller packetblob is insufficient to trim bitrate.
       frame will need to be truncated */
    long maxsize=(max_target_bits+(bi->reservoir_bits-bm->minmax_reservoir))/8;
    bm->choice=choice=0;

    if(oggpack_bytes(vbi->packetblob[choice])>maxsize){

      oggpack_writetrunc(vbi->packetblob[choice],maxsize*8);
      this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
    }
  }else{
    long minsize=(min_target_bits-bm->minmax_reservoir+7)/8;
    if(choice>=PACKETBLOBS)
      choice=PACKETBLOBS-1;

    bm->choice=choice;

    /* prop up bitrate according to demand. pad this frame out with zeroes */
    minsize-=oggpack_bytes(vbi->packetblob[choice]);
    while(minsize-->0)oggpack_write(vbi->packetblob[choice],0,8);
    this_bits=oggpack_bytes(vbi->packetblob[choice])*8;

  }

  /* now we have the final packet and the final packet size.  Update statistics */
  /* min and max reservoir */
  if(bm->min_bitsper>0 || bm->max_bitsper>0){

    if(max_target_bits>0 && this_bits>max_target_bits){
      bm->minmax_reservoir+=(this_bits-max_target_bits);
    }else if(min_target_bits>0 && this_bits<min_target_bits){
      bm->minmax_reservoir+=(this_bits-min_target_bits);
    }else{
      /* inbetween; we want to take reservoir toward but not past desired_fill */
      if(bm->minmax_reservoir>desired_fill){
        if(max_target_bits>0){ /* logical bulletproofing against initialization state */
          bm->minmax_reservoir+=(this_bits-max_target_bits);
          if(bm->minmax_reservoir<desired_fill)bm->minmax_reservoir=desired_fill;
        }else{
          bm->minmax_reservoir=desired_fill;
        }
      }else{
        if(min_target_bits>0){ /* logical bulletproofing against initialization state */
          bm->minmax_reservoir+=(this_bits-min_target_bits);
          if(bm->minmax_reservoir>desired_fill)bm->minmax_reservoir=desired_fill;
        }else{
          bm->minmax_reservoir=desired_fill;
        }
      }
    }
  }

  /* avg reservoir */
  if(bm->avg_bitsper>0){
    long avg_target_bits=(vb->W?bm->avg_bitsper*bm->short_per_long:bm->avg_bitsper);
    bm->avg_reservoir+=this_bits-avg_target_bits;
  }

  return(0);
}